

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O3

void __thiscall QHttpPartPrivate::checkHeaderCreated(QHttpPartPrivate *this)

{
  qsizetype qVar1;
  long i;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QLatin1StringView QVar3;
  QHttpHeaders h;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  local_70;
  QHttpHeaders local_40;
  pair<QByteArray,_QByteArray> *local_38;
  
  local_38 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  if (this->headerCreated == false) {
    local_40.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc0);
    qVar1 = QHttpHeaders::size(&stack0xffffffffffffffc0);
    if (0 < qVar1) {
      i = 0;
      do {
        QVar3 = QHttpHeaders::nameAt(&stack0xffffffffffffffc0,i);
        local_70.a.b = QHttpHeaders::valueAt(&stack0xffffffffffffffc0,i);
        local_70.a.a.b = (char (*) [3])0x27b345;
        local_70.b = (char (*) [3])0x269eb2;
        local_70.a.a.a = (QByteArrayView)QVar3;
        QtStringBuilder::
        appendToByteArray<QStringBuilder<QStringBuilder<QByteArrayView,char_const(&)[3]>,QByteArrayView>,char_const(&)[3]>
                  (&this->header,&local_70,'\0');
        i = i + 1;
        qVar1 = QHttpHeaders::size(&stack0xffffffffffffffc0);
      } while (i < qVar1);
    }
    QVar2.m_data = (storage_type *)0x2;
    QVar2.m_size = (this->header).d.size;
    QByteArray::insert((longlong)&this->header,QVar2);
    this->headerCreated = true;
    QHttpHeaders::~QHttpHeaders(&stack0xffffffffffffffc0);
  }
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpPartPrivate::checkHeaderCreated() const
{
    if (!headerCreated) {
        // copied from QHttpNetworkRequestPrivate::header() and adapted
        const auto h = headers();
        for (qsizetype i = 0; i < h.size(); ++i) {
            const auto name = h.nameAt(i);
            header += QByteArrayView(name.data(), name.size()) + ": " + h.valueAt(i) + "\r\n";
        }

        header += "\r\n";
        headerCreated = true;
    }
}